

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O3

void __thiscall Linker::~Linker(Linker *this)

{
  CleanCode(this);
  if ((this->fullLinkerData).data != (uchar *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  HashMap<unsigned_int>::~HashMap(&this->funcMap);
  HashMap<unsigned_int>::~HashMap(&this->typeMap);
  if ((this->moduleRemap).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->funcRemap).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->typeRemap).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->expiredRegVmConstants).data != (uint **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->expiredRegVmCode).data != (RegVmCmd **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->regVmJumpTargets).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exRegVmRegKillInfo).data != (uchar *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exRegVmConstants).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exRegVmExecCount).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exRegVmSourceInfo).data != (ExternSourceInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exRegVmCode).data != (RegVmCmd *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exMainModuleName).data != (char *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exImportPaths).data != (char *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exSource).data != (char *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exSymbols).data != (char *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exModules).data != (ExternModuleInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exLocals).data != (ExternLocalInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exFunctionExplicitTypes).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exFunctionExplicitTypeArrayOffsets).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exFunctions).data != (ExternFuncInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exVariables).data != (ExternVarInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exTypeConstants).data != (ExternConstantInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exTypeExtra).data != (ExternMemberInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->exTypes).data != (ExternTypeInfo *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  return;
}

Assistant:

Linker::~Linker()
{
	CleanCode();
}